

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationBounds_Test::TestBody
          (TimeUtilTest_DurationBounds_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int64_t iVar5;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  char *regex_05;
  char *regex_06;
  char *regex_07;
  char *regex_08;
  char *regex_09;
  char *regex_10;
  char *regex_11;
  char *regex_12;
  AssertHelper local_768;
  Message local_760 [6];
  exception *gtest_exception_13;
  ReturnSentinel gtest_sentinel_13;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_13;
  pointer local_708;
  DeathTest *gtest_dt_13;
  Message local_6f8 [6];
  exception *gtest_exception_12;
  ReturnSentinel gtest_sentinel_12;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_12;
  pointer local_6a0;
  DeathTest *gtest_dt_12;
  Message local_690 [6];
  exception *gtest_exception_11;
  ReturnSentinel gtest_sentinel_11;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_11;
  pointer local_638;
  DeathTest *gtest_dt_11;
  Message local_628 [6];
  exception *gtest_exception_10;
  ReturnSentinel gtest_sentinel_10;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_10;
  pointer local_5d0;
  DeathTest *gtest_dt_10;
  Message local_5c0 [6];
  exception *gtest_exception_9;
  ReturnSentinel gtest_sentinel_9;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_9;
  pointer local_568;
  DeathTest *gtest_dt_9;
  Message local_558 [6];
  exception *gtest_exception_8;
  ReturnSentinel gtest_sentinel_8;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_8;
  pointer local_500;
  DeathTest *gtest_dt_8;
  Message local_4f0 [6];
  exception *gtest_exception_7;
  ReturnSentinel gtest_sentinel_7;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_7;
  pointer local_498;
  DeathTest *gtest_dt_7;
  Message local_488 [6];
  exception *gtest_exception_6;
  ReturnSentinel gtest_sentinel_6;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_6;
  pointer local_430;
  DeathTest *gtest_dt_6;
  Message local_420 [6];
  exception *gtest_exception_5;
  ReturnSentinel local_3c8;
  ReturnSentinel gtest_sentinel_5;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_5;
  pointer local_3a0;
  DeathTest *gtest_dt_5;
  Message local_390 [6];
  exception *gtest_exception_4;
  ReturnSentinel local_338;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_310;
  DeathTest *gtest_dt_4;
  Message local_300 [6];
  exception *gtest_exception_3;
  ReturnSentinel local_2a8;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_280;
  DeathTest *gtest_dt_3;
  Message local_270 [6];
  exception *gtest_exception_2;
  ReturnSentinel local_218;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_1f0;
  DeathTest *gtest_dt_2;
  Message local_1e0 [6];
  exception *gtest_exception_1;
  ReturnSentinel local_188;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_160;
  DeathTest *gtest_dt_1;
  Message local_150;
  int local_144;
  exception *gtest_exception;
  ReturnSentinel local_f0;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_c8;
  DeathTest *gtest_dt;
  Duration underflow_nanos;
  Duration overflow_nanos;
  Duration underflow;
  undefined1 local_38 [8];
  Duration overflow;
  TimeUtilTest_DurationBounds_Test *this_local;
  
  overflow.field_0._16_8_ = this;
  Duration::Duration((Duration *)local_38);
  Duration::set_seconds((Duration *)local_38,0x4979cb9e01);
  Duration::Duration((Duration *)((long)&overflow_nanos.field_0 + 0x10));
  Duration::set_seconds((Duration *)((long)&overflow_nanos.field_0 + 0x10),-0x4979cb9e01);
  Duration::Duration((Duration *)((long)&underflow_nanos.field_0 + 0x10));
  Duration::set_nanos((Duration *)((long)&underflow_nanos.field_0 + 0x10),1000000000);
  Duration::Duration((Duration *)&gtest_dt);
  Duration::set_nanos((Duration *)&gtest_dt,-1000000000);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"Duration seconds",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(overflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ad,&local_c8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c6ba0;
    if (local_c8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_c8);
      iVar2 = (*local_c8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_c8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_c8->_vptr_DeathTest[4])(local_c8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c6b62;
        local_144 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_f0,local_c8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            iVar5 = Duration::seconds((Duration *)local_38);
            TimeUtil::SecondsToDuration((Duration *)&gtest_exception,iVar5);
            Duration::~Duration((Duration *)&gtest_exception);
          }
          (*local_c8->_vptr_DeathTest[5])(local_c8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_f0);
        }
LAB_011c6b62:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_144 != 0) goto LAB_011c6ba0;
    }
  }
  else {
LAB_011c6ba0:
    testing::Message::Message(&local_150);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_150);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"Duration seconds",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(underflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1af,&local_160);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c6ff5;
    if (local_160 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_160);
      iVar2 = (*local_160->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_160->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_160->_vptr_DeathTest[4])(local_160,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c6fb7;
        local_144 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_188,local_160);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            iVar5 = Duration::seconds((Duration *)((long)&overflow_nanos.field_0 + 0x10));
            TimeUtil::SecondsToDuration((Duration *)&gtest_exception_1,iVar5);
            Duration::~Duration((Duration *)&gtest_exception_1);
          }
          (*local_160->_vptr_DeathTest[5])(local_160,2);
          local_144 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_188);
        }
LAB_011c6fb7:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_144 != 0) goto LAB_011c6ff5;
    }
  }
  else {
LAB_011c6ff5:
    testing::Message::Message(local_1e0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1af,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_1e0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)"Duration minutes",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b2,&local_1f0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c7470;
    if (local_1f0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_1f0);
      iVar2 = (*local_1f0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1f0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1f0->_vptr_DeathTest[4])(local_1f0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c7432;
        local_144 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_218,local_1f0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            iVar5 = Duration::seconds((Duration *)local_38);
            TimeUtil::MinutesToDuration((Duration *)&gtest_exception_2,iVar5 / 0x3c + 1);
            Duration::~Duration((Duration *)&gtest_exception_2);
          }
          (*local_1f0->_vptr_DeathTest[5])(local_1f0,2);
          local_144 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_218);
        }
LAB_011c7432:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_144 != 0) goto LAB_011c7470;
    }
  }
  else {
LAB_011c7470:
    testing::Message::Message(local_270);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_270);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)"Duration minutes",regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b5,&local_280);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c78eb;
    if (local_280 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_280);
      iVar2 = (*local_280->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_280->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_280->_vptr_DeathTest[4])(local_280,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c78ad;
        local_144 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_2a8,local_280);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            iVar5 = Duration::seconds((Duration *)((long)&overflow_nanos.field_0 + 0x10));
            TimeUtil::MinutesToDuration((Duration *)&gtest_exception_3,iVar5 / 0x3c + -1);
            Duration::~Duration((Duration *)&gtest_exception_3);
          }
          (*local_280->_vptr_DeathTest[5])(local_280,2);
          local_144 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_2a8);
        }
LAB_011c78ad:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_144 != 0) goto LAB_011c78eb;
    }
  }
  else {
LAB_011c78eb:
    testing::Message::Message(local_300);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_4,local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_4);
    testing::Message::~Message(local_300);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4,(internal *)"Duration hours",regex_03);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_4,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b8,&local_310);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c7d66;
    if (local_310 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_4,local_310);
      iVar2 = (*local_310->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_310->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_310->_vptr_DeathTest[4])(local_310,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c7d28;
        local_144 = 10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_338,local_310);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            iVar5 = Duration::seconds((Duration *)local_38);
            TimeUtil::HoursToDuration((Duration *)&gtest_exception_4,iVar5 / 0x3c + 1);
            Duration::~Duration((Duration *)&gtest_exception_4);
          }
          (*local_310->_vptr_DeathTest[5])(local_310,2);
          local_144 = 0xb;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_338);
        }
LAB_011c7d28:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_4);
      if (local_144 != 0) goto LAB_011c7d66;
    }
  }
  else {
LAB_011c7d66:
    testing::Message::Message(local_390);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_5,local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_5);
    testing::Message::~Message(local_390);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5,(internal *)"Duration hours",regex_04);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_5,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1bb,&local_3a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c81e1;
    if (local_3a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_5,local_3a0);
      iVar2 = (*local_3a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_3a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_3a0->_vptr_DeathTest[4])(local_3a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c81a3;
        local_144 = 0xc;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_3c8,local_3a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            iVar5 = Duration::seconds((Duration *)((long)&overflow_nanos.field_0 + 0x10));
            TimeUtil::HoursToDuration((Duration *)&gtest_exception_5,iVar5 / 0x3c + -1);
            Duration::~Duration((Duration *)&gtest_exception_5);
          }
          (*local_3a0->_vptr_DeathTest[5])(local_3a0,2);
          local_144 = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_3c8);
        }
LAB_011c81a3:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_5);
      if (local_144 != 0) goto LAB_011c81e1;
    }
  }
  else {
LAB_011c81e1:
    testing::Message::Message(local_420);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1bb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_6,local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_6);
    testing::Message::~Message(local_420);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_6,(internal *)0x211a1ba,regex_05);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_6,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1be,&local_430);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_6);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c860e;
    if (local_430 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_6,local_430);
      iVar2 = (*local_430->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_430->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_430->_vptr_DeathTest[4])(local_430,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c85d0;
        local_144 = 0xe;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_6,local_430);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToNanoseconds((Duration *)local_38);
          }
          (*local_430->_vptr_DeathTest[5])(local_430,2);
          local_144 = 0xf;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_6);
        }
LAB_011c85d0:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_6);
      if (local_144 != 0) goto LAB_011c860e;
    }
  }
  else {
LAB_011c860e:
    testing::Message::Message(local_488);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1be,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_7,local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_7);
    testing::Message::~Message(local_488);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_7,(internal *)0x211a1ba,regex_06);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_7,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c0,&local_498);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_7);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c8a3b;
    if (local_498 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_7,local_498);
      iVar2 = (*local_498->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_498->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_498->_vptr_DeathTest[4])(local_498,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c89fd;
        local_144 = 0x10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_7,local_498);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToNanoseconds((Duration *)((long)&overflow_nanos.field_0 + 0x10));
          }
          (*local_498->_vptr_DeathTest[5])(local_498,2);
          local_144 = 0x11;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_7);
        }
LAB_011c89fd:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_7);
      if (local_144 != 0) goto LAB_011c8a3b;
    }
  }
  else {
LAB_011c8a3b:
    testing::Message::Message(local_4f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_8,local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_8);
    testing::Message::~Message(local_4f0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_8,(internal *)0x211a1ba,regex_07);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c2,&local_500);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_8);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c8e6b;
    if (local_500 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_8,local_500);
      iVar2 = (*local_500->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_500->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_500->_vptr_DeathTest[4])(local_500,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c8e2d;
        local_144 = 0x12;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_8,local_500);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToNanoseconds((Duration *)((long)&underflow_nanos.field_0 + 0x10));
          }
          (*local_500->_vptr_DeathTest[5])(local_500,2);
          local_144 = 0x13;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_8);
        }
LAB_011c8e2d:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_8);
      if (local_144 != 0) goto LAB_011c8e6b;
    }
  }
  else {
LAB_011c8e6b:
    testing::Message::Message(local_558);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_9,local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_9);
    testing::Message::~Message(local_558);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_9,(internal *)0x211a1ba,regex_08);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_9,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c4,&local_568);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_9);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c929b;
    if (local_568 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_9,local_568);
      iVar2 = (*local_568->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_568->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_568->_vptr_DeathTest[4])(local_568,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c925d;
        local_144 = 0x14;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_9,local_568);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToNanoseconds((Duration *)&gtest_dt);
          }
          (*local_568->_vptr_DeathTest[5])(local_568,2);
          local_144 = 0x15;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_9);
        }
LAB_011c925d:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_9);
      if (local_144 != 0) goto LAB_011c929b;
    }
  }
  else {
LAB_011c929b:
    testing::Message::Message(local_5c0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_10,local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_10);
    testing::Message::~Message(local_5c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_10,(internal *)0x211a1ba,regex_09);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_10,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c6,&local_5d0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_10);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c96c8;
    if (local_5d0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_10,local_5d0);
      iVar2 = (*local_5d0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_5d0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_5d0->_vptr_DeathTest[4])(local_5d0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c968a;
        local_144 = 0x16;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_10,local_5d0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToSeconds((Duration *)local_38);
          }
          (*local_5d0->_vptr_DeathTest[5])(local_5d0,2);
          local_144 = 0x17;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_10);
        }
LAB_011c968a:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_10);
      if (local_144 != 0) goto LAB_011c96c8;
    }
  }
  else {
LAB_011c96c8:
    testing::Message::Message(local_628);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_11,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_11);
    testing::Message::~Message(local_628);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_11,(internal *)0x211a1ba,regex_10);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_11,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c8,&local_638);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_11);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c9af5;
    if (local_638 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_11,local_638);
      iVar2 = (*local_638->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_638->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_638->_vptr_DeathTest[4])(local_638,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c9ab7;
        local_144 = 0x18;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_11,local_638);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToSeconds((Duration *)((long)&overflow_nanos.field_0 + 0x10));
          }
          (*local_638->_vptr_DeathTest[5])(local_638,2);
          local_144 = 0x19;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_11);
        }
LAB_011c9ab7:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_11);
      if (local_144 != 0) goto LAB_011c9af5;
    }
  }
  else {
LAB_011c9af5:
    testing::Message::Message(local_690);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_12,local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_12);
    testing::Message::~Message(local_690);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_12,(internal *)0x211a1ba,regex_11);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_12,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ca,&local_6a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_12);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_011c9f25;
    if (local_6a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_12,local_6a0);
      iVar2 = (*local_6a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_6a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_6a0->_vptr_DeathTest[4])(local_6a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011c9ee7;
        local_144 = 0x1a;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_12,local_6a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToSeconds((Duration *)((long)&underflow_nanos.field_0 + 0x10));
          }
          (*local_6a0->_vptr_DeathTest[5])(local_6a0,2);
          local_144 = 0x1b;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_12);
        }
LAB_011c9ee7:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_12);
      if (local_144 != 0) goto LAB_011c9f25;
    }
  }
  else {
LAB_011c9f25:
    testing::Message::Message(local_6f8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ca,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_13,local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_13);
    testing::Message::~Message(local_6f8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_13,(internal *)0x211a1ba,regex_12);
    bVar1 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_13,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1cc,&local_708);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_13);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_708 == (pointer)0x0) goto LAB_011ca3fa;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_13,local_708);
      iVar2 = (*local_708->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_708->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_708->_vptr_DeathTest[4])(local_708,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_011ca317;
        local_144 = 0x1c;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_13,local_708);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            TimeUtil::DurationToSeconds((Duration *)&gtest_dt);
          }
          (*local_708->_vptr_DeathTest[5])(local_708,2);
          local_144 = 0x1d;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_13);
        }
LAB_011ca317:
        local_144 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_13);
      if (local_144 == 0) goto LAB_011ca3fa;
    }
  }
  testing::Message::Message(local_760);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_768,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
             ,0x1cc,pcVar4);
  testing::internal::AssertHelper::operator=(&local_768,local_760);
  testing::internal::AssertHelper::~AssertHelper(&local_768);
  testing::Message::~Message(local_760);
LAB_011ca3fa:
  Duration::~Duration((Duration *)&gtest_dt);
  Duration::~Duration((Duration *)((long)&underflow_nanos.field_0 + 0x10));
  Duration::~Duration((Duration *)((long)&overflow_nanos.field_0 + 0x10));
  Duration::~Duration((Duration *)local_38);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationBounds) {
  Duration overflow;
  overflow.set_seconds(TimeUtil::kDurationMaxSeconds + 1);
  Duration underflow;
  underflow.set_seconds(TimeUtil::kDurationMinSeconds - 1);
  Duration overflow_nanos;
  overflow_nanos.set_nanos(TimeUtil::kDurationMaxNanoseconds + 1);
  Duration underflow_nanos;
  underflow_nanos.set_nanos(TimeUtil::kDurationMinNanoseconds - 1);

  EXPECT_DEATH({ TimeUtil::SecondsToDuration(overflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH({ TimeUtil::SecondsToDuration(underflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); },
      "Duration hours");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); },
      "Duration hours");

  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow_nanos); },
                     "outside of the valid range");
}